

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

int Sfm_ObjLevelNewR(Vec_Int_t *vArray,Vec_Int_t *vLevelsR,int fAddLevel)

{
  int iVar1;
  undefined4 local_28;
  int LevelR;
  int Fanout;
  int k;
  int fAddLevel_local;
  Vec_Int_t *vLevelsR_local;
  Vec_Int_t *vArray_local;
  
  local_28 = 0;
  for (LevelR = 0; iVar1 = Vec_IntSize(vArray), LevelR < iVar1; LevelR = LevelR + 1) {
    iVar1 = Vec_IntEntry(vArray,LevelR);
    iVar1 = Vec_IntEntry(vLevelsR,iVar1);
    local_28 = Abc_MaxInt(local_28,iVar1);
  }
  return local_28 + fAddLevel;
}

Assistant:

static inline int Sfm_ObjLevelNewR( Vec_Int_t * vArray, Vec_Int_t * vLevelsR, int fAddLevel )
{
    int k, Fanout, LevelR = 0;
    Vec_IntForEachEntry( vArray, Fanout, k )
        LevelR = Abc_MaxInt( LevelR, Vec_IntEntry(vLevelsR, Fanout) );
    return LevelR + fAddLevel;
}